

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> __thiscall
unodb::detail::
basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
::
remove_or_choose_subtree<std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>*>,std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
          (basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
           *this,node_type type,byte *args,
          basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *args_1,
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *args_2,basic_node_ptr<unodb::detail::node_header> **args_3)

{
  undefined7 in_register_00000031;
  _Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true> _Var1;
  
  switch(CONCAT71(in_register_00000031,type) & 0xffffffff) {
  case 0:
    cannot_happen("/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x37e,"remove_or_choose_subtree");
  case 1:
    _Var1._M_payload.
    super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> =
         (_Optional_payload<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true,_true>
          )inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
           ::
           remove_or_choose_subtree<std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
                     ((inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                       *)this,args,args_1,args_2,args_3);
    return (_Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>)
           (_Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>)
           _Var1._M_payload.
           super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
    ;
  case 2:
    _Var1._M_payload.
    super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> =
         (_Optional_payload<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true,_true>
          )inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
           ::
           remove_or_choose_subtree<std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
                     ((inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                       *)this,args,args_1,args_2,args_3);
    return (_Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>)
           (_Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>)
           _Var1._M_payload.
           super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
    ;
  case 3:
    _Var1._M_payload.
    super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> =
         (_Optional_payload<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true,_true>
          )inode_48<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
           ::
           remove_or_choose_subtree<std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
                     ((inode_48<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                       *)this,args,args_1,args_2,args_3);
    return (_Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>)
           (_Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>)
           _Var1._M_payload.
           super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
    ;
  case 4:
    _Var1._M_payload.
    super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> =
         (_Optional_payload<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true,_true>
          )inode_256<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
           ::
           remove_or_choose_subtree<std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
                     ((inode_256<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                       *)this,args,args_1,args_2,args_3);
    return (_Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>)
           (_Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>)
           _Var1._M_payload.
           super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
    ;
  default:
    cannot_happen("/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x380,"remove_or_choose_subtree");
  }
}

Assistant:

[[nodiscard]] ReturnType remove_or_choose_subtree(node_type type,
                                                    Args &&...args) {
    switch (type) {
      case node_type::I4:
        return static_cast<inode4_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I16:
        return static_cast<inode16_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I48:
        return static_cast<inode48_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I256:
        return static_cast<inode256_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
        // LCOV_EXCL_START
      case node_type::LEAF:
        UNODB_DETAIL_CANNOT_HAPPEN();
    }
    UNODB_DETAIL_CANNOT_HAPPEN();
    // LCOV_EXCL_STOP
  }